

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareUnknownFields
          (MessageDifferencer *this,Message *message1,Message *message2,
          UnknownFieldSet *unknown_field_set1,UnknownFieldSet *unknown_field_set2,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_field)

{
  pointer *ppSVar1;
  pointer pUVar2;
  pointer pUVar3;
  undefined1 auVar4 [8];
  undefined1 auVar5 [8];
  bool bVar6;
  __type _Var7;
  undefined1 uVar8;
  uint32 uVar9;
  uint32 uVar10;
  int iVar11;
  ulong uVar12;
  uint64 uVar13;
  uint64 uVar14;
  string *__lhs;
  string *__rhs;
  uint uVar15;
  int iVar16;
  IndexUnknownFieldPair *extraout_RDX;
  IndexUnknownFieldPair *extraout_RDX_00;
  IndexUnknownFieldPair *extraout_RDX_01;
  IndexUnknownFieldPair *b;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar17;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  IndexUnknownFieldPair *a;
  UnknownField *this_00;
  UnknownField *local_e8;
  undefined1 auStack_d8 [8];
  vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
  fields1;
  undefined1 auStack_78 [8];
  vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
  fields2;
  undefined7 uVar18;
  
  if (this->message_field_comparison_ != EQUIVALENT) {
    pUVar2 = (unknown_field_set1->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pUVar3 = (unknown_field_set1->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pUVar2 != pUVar3) ||
       ((unknown_field_set2->fields_).
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (unknown_field_set2->fields_).
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      fields1.
      super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_d8 = (undefined1  [8])0x0;
      fields1.
      super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fields2.
      super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_78 = (undefined1  [8])0x0;
      fields2.
      super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::
      vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ::reserve((vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                 *)auStack_d8,(long)(int)((ulong)((long)pUVar3 - (long)pUVar2) >> 4));
      std::
      vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ::reserve((vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                 *)auStack_78,
                (long)(int)((ulong)((long)(unknown_field_set2->fields_).
                                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(unknown_field_set2->fields_).
                                         super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4));
      for (lVar20 = 0;
          lVar20 < (int)((ulong)((long)(unknown_field_set1->fields_).
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(unknown_field_set1->fields_).
                                      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4);
          lVar20 = lVar20 + 1) {
        fields1.
        super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT44(fields1.
                               super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(int)lVar20)
        ;
        std::
        vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>
        ::emplace_back<std::pair<int,google::protobuf::UnknownField_const*>>
                  ((vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>
                    *)auStack_d8,
                   (pair<int,_const_google::protobuf::UnknownField_*> *)
                   &fields1.
                    super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      for (lVar20 = 0;
          lVar20 < (int)((ulong)((long)(unknown_field_set2->fields_).
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(unknown_field_set2->fields_).
                                      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4);
          lVar20 = lVar20 + 1) {
        fields1.
        super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT44(fields1.
                               super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(int)lVar20)
        ;
        std::
        vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>
        ::emplace_back<std::pair<int,google::protobuf::UnknownField_const*>>
                  ((vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>
                    *)auStack_78,
                   (pair<int,_const_google::protobuf::UnknownField_*> *)
                   &fields1.
                    super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::
      stable_sort<__gnu_cxx::__normal_iterator<std::pair<int,google::protobuf::UnknownField_const*>*,std::vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>>,google::protobuf::util::(anonymous_namespace)::UnknownFieldOrdering>
                (auStack_d8,
                 fields1.
                 super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      std::
      stable_sort<__gnu_cxx::__normal_iterator<std::pair<int,google::protobuf::UnknownField_const*>*,std::vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>>,google::protobuf::util::(anonymous_namespace)::UnknownFieldOrdering>
                (auStack_78,
                 fields2.
                 super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      local_e8 = (UnknownField *)0x0;
      iVar11 = 0;
      iVar16 = 0;
      b = extraout_RDX;
LAB_003421bb:
      do {
        auVar5 = auStack_78;
        auVar4 = auStack_d8;
        uVar22 = (ulong)iVar11;
        uVar21 = (long)fields1.
                       super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_d8 >> 4;
        uVar12 = (long)fields2.
                       super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_78 >> 4;
        uVar23 = (ulong)iVar16;
        if (uVar22 < uVar21) {
          if ((uVar12 != uVar23) &&
             (bVar6 = anon_unknown_5::UnknownFieldOrdering::operator()
                                ((UnknownFieldOrdering *)((long)auStack_d8 + uVar22 * 0x10),
                                 (IndexUnknownFieldPair *)((long)auStack_78 + uVar23 * 0x10),b),
             b = extraout_RDX_00, !bVar6)) goto LAB_0034222c;
          this_00 = ((pointer)((long)auVar4 + uVar22 * 0x10))->second;
          uVar19 = 1;
          goto LAB_0034234e;
        }
        if (uVar12 <= uVar23) {
          bVar6 = true;
          goto LAB_003425f8;
        }
LAB_0034222c:
        if (uVar21 != uVar22) {
          a = (IndexUnknownFieldPair *)((long)auVar4 + uVar22 * 0x10);
          bVar6 = anon_unknown_5::UnknownFieldOrdering::operator()
                            ((UnknownFieldOrdering *)((long)auVar5 + uVar23 * 0x10),a,b);
          b = extraout_RDX_01;
          if (bVar6) goto LAB_00342252;
          this_00 = a->second;
          b = (IndexUnknownFieldPair *)CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),1);
          switch(this_00->type_) {
          case 0:
            uVar13 = UnknownField::varint(this_00);
            uVar14 = UnknownField::varint(((pointer)((long)auStack_78 + uVar23 * 0x10))->second);
            uVar17 = extraout_RDX_02;
            goto LAB_003422e4;
          case 1:
            uVar9 = UnknownField::fixed32(this_00);
            uVar10 = UnknownField::fixed32(((pointer)((long)auStack_78 + uVar23 * 0x10))->second);
            uVar18 = (undefined7)((ulong)extraout_RDX_05 >> 8);
            _Var7 = uVar9 == uVar10;
            goto LAB_0034232f;
          case 2:
            uVar13 = UnknownField::fixed64(this_00);
            uVar14 = UnknownField::fixed64(((pointer)((long)auStack_78 + uVar23 * 0x10))->second);
            uVar17 = extraout_RDX_03;
LAB_003422e4:
            uVar18 = (undefined7)((ulong)uVar17 >> 8);
            _Var7 = uVar13 == uVar14;
LAB_0034232f:
            b = (IndexUnknownFieldPair *)CONCAT71(uVar18,1);
            break;
          case 3:
            __lhs = UnknownField::length_delimited_abi_cxx11_(this_00);
            __rhs = UnknownField::length_delimited_abi_cxx11_
                              (((pointer)((long)auStack_78 + uVar23 * 0x10))->second);
            _Var7 = std::operator==(__lhs,__rhs);
            b = (IndexUnknownFieldPair *)CONCAT71((int7)((ulong)extraout_RDX_04 >> 8),1);
            break;
          case 4:
            b = (IndexUnknownFieldPair *)0x0;
            uVar19 = 3;
            _Var7 = false;
            goto LAB_00342339;
          default:
            _Var7 = false;
          }
          uVar19 = 2;
LAB_00342339:
          uVar15 = 4;
          if (_Var7 == false) {
            uVar15 = uVar19;
          }
          if ((char)b != '\0') {
            uVar19 = uVar15;
          }
LAB_0034234e:
          if (((local_e8 == (UnknownField *)0x0) || (this_00->number_ != local_e8->number_)) ||
             (this_00->type_ != local_e8->type_)) {
            local_e8 = this_00;
          }
          if ((uVar19 != 4) || (this->reporter_ != (Reporter *)0x0)) {
            fields1.
            super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            bVar6 = IsUnknownFieldIgnored
                              (this,message1,message2,
                               (SpecificField *)
                               &fields1.
                                super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,parent_field);
            if (bVar6) {
              if (this->reporter_ != (Reporter *)0x0) {
                std::
                vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                ::push_back(parent_field,
                            (value_type *)
                            &fields1.
                             super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                (*this->reporter_->_vptr_Reporter[8])
                          (this->reporter_,message1,message2,parent_field);
                ppSVar1 = &(parent_field->
                           super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppSVar1 = *ppSVar1 + -1;
              }
            }
            else if ((2 < uVar19) || (this->reporter_ != (Reporter *)0x0)) {
              std::
              vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              ::push_back(parent_field,
                          (value_type *)
                          &fields1.
                           super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
              uVar8 = (*(code *)(&DAT_0036f088 + *(int *)(&DAT_0036f088 + (ulong)uVar19 * 4)))();
              return (bool)uVar8;
            }
LAB_003425f8:
            std::
            _Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
            ::~_Vector_base((_Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                             *)auStack_78);
            std::
            _Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
            ::~_Vector_base((_Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                             *)auStack_d8);
            return bVar6;
          }
          iVar11 = iVar11 + 1;
          iVar16 = iVar16 + 1;
          goto LAB_003421bb;
        }
LAB_00342252:
        if (this->scope_ != PARTIAL) {
          this_00 = ((pointer)((long)auVar5 + uVar23 * 0x10))->second;
          uVar19 = 0;
          goto LAB_0034234e;
        }
        iVar16 = iVar16 + 1;
      } while( true );
    }
  }
  return true;
}

Assistant:

bool MessageDifferencer::CompareUnknownFields(
    const Message& message1, const Message& message2,
    const UnknownFieldSet& unknown_field_set1,
    const UnknownFieldSet& unknown_field_set2,
    std::vector<SpecificField>* parent_field) {
  // Ignore unknown fields in EQUIVALENT mode.
  if (message_field_comparison_ == EQUIVALENT) return true;

  if (unknown_field_set1.empty() && unknown_field_set2.empty()) {
    return true;
  }

  bool is_different = false;

  // We first sort the unknown fields by field number and type (in other words,
  // in tag order), making sure to preserve ordering of values with the same
  // tag.  This allows us to report only meaningful differences between the
  // two sets -- that is, differing values for the same tag.  We use
  // IndexUnknownFieldPairs to keep track of the field's original index for
  // reporting purposes.
  std::vector<IndexUnknownFieldPair> fields1;  // unknown_field_set1, sorted
  std::vector<IndexUnknownFieldPair> fields2;  // unknown_field_set2, sorted
  fields1.reserve(unknown_field_set1.field_count());
  fields2.reserve(unknown_field_set2.field_count());

  for (int i = 0; i < unknown_field_set1.field_count(); i++) {
    fields1.push_back(std::make_pair(i, &unknown_field_set1.field(i)));
  }
  for (int i = 0; i < unknown_field_set2.field_count(); i++) {
    fields2.push_back(std::make_pair(i, &unknown_field_set2.field(i)));
  }

  UnknownFieldOrdering is_before;
  std::stable_sort(fields1.begin(), fields1.end(), is_before);
  std::stable_sort(fields2.begin(), fields2.end(), is_before);

  // In order to fill in SpecificField::index, we have to keep track of how
  // many values we've seen with the same field number and type.
  // current_repeated points at the first field in this range, and
  // current_repeated_start{1,2} are the indexes of the first field in the
  // range within fields1 and fields2.
  const UnknownField* current_repeated = NULL;
  int current_repeated_start1 = 0;
  int current_repeated_start2 = 0;

  // Now that we have two sorted lists, we can detect fields which appear only
  // in one list or the other by traversing them simultaneously.
  int index1 = 0;
  int index2 = 0;
  while (index1 < fields1.size() || index2 < fields2.size()) {
    enum {
      ADDITION,
      DELETION,
      MODIFICATION,
      COMPARE_GROUPS,
      NO_CHANGE
    } change_type;

    // focus_field is the field we're currently reporting on.  (In the case
    // of a modification, it's the field on the left side.)
    const UnknownField* focus_field;
    bool match = false;

    if (index2 == fields2.size() ||
        (index1 < fields1.size() &&
         is_before(fields1[index1], fields2[index2]))) {
      // fields1[index1] is not present in fields2.
      change_type = DELETION;
      focus_field = fields1[index1].second;
    } else if (index1 == fields1.size() ||
               is_before(fields2[index2], fields1[index1])) {
      // fields2[index2] is not present in fields1.
      if (scope_ == PARTIAL) {
        // Ignore.
        ++index2;
        continue;
      }
      change_type = ADDITION;
      focus_field = fields2[index2].second;
    } else {
      // Field type and number are the same.  See if the values differ.
      change_type = MODIFICATION;
      focus_field = fields1[index1].second;

      switch (focus_field->type()) {
        case UnknownField::TYPE_VARINT:
          match = fields1[index1].second->varint() ==
                  fields2[index2].second->varint();
          break;
        case UnknownField::TYPE_FIXED32:
          match = fields1[index1].second->fixed32() ==
                  fields2[index2].second->fixed32();
          break;
        case UnknownField::TYPE_FIXED64:
          match = fields1[index1].second->fixed64() ==
                  fields2[index2].second->fixed64();
          break;
        case UnknownField::TYPE_LENGTH_DELIMITED:
          match = fields1[index1].second->length_delimited() ==
                  fields2[index2].second->length_delimited();
          break;
        case UnknownField::TYPE_GROUP:
          // We must deal with this later, after building the SpecificField.
          change_type = COMPARE_GROUPS;
          break;
      }
      if (match && change_type != COMPARE_GROUPS) {
        change_type = NO_CHANGE;
      }
    }

    if (current_repeated == NULL ||
        focus_field->number() != current_repeated->number() ||
        focus_field->type() != current_repeated->type()) {
      // We've started a new repeated field.
      current_repeated = focus_field;
      current_repeated_start1 = index1;
      current_repeated_start2 = index2;
    }

    if (change_type == NO_CHANGE && reporter_ == NULL) {
      // Fields were already compared and matched and we have no reporter.
      ++index1;
      ++index2;
      continue;
    }

    // Build the SpecificField.  This is slightly complicated.
    SpecificField specific_field;
    specific_field.unknown_field_number = focus_field->number();
    specific_field.unknown_field_type = focus_field->type();

    specific_field.unknown_field_set1 = &unknown_field_set1;
    specific_field.unknown_field_set2 = &unknown_field_set2;

    if (change_type != ADDITION) {
      specific_field.unknown_field_index1 = fields1[index1].first;
    }
    if (change_type != DELETION) {
      specific_field.unknown_field_index2 = fields2[index2].first;
    }

    // Calculate the field index.
    if (change_type == ADDITION) {
      specific_field.index = index2 - current_repeated_start2;
      specific_field.new_index = index2 - current_repeated_start2;
    } else {
      specific_field.index = index1 - current_repeated_start1;
      specific_field.new_index = index2 - current_repeated_start2;
    }

    if (IsUnknownFieldIgnored(message1, message2, specific_field,
                              *parent_field)) {
      if (reporter_ != NULL) {
        parent_field->push_back(specific_field);
        reporter_->ReportUnknownFieldIgnored(message1, message2, *parent_field);
        parent_field->pop_back();
      }
      return true;
    }

    if (change_type == ADDITION || change_type == DELETION ||
        change_type == MODIFICATION) {
      if (reporter_ == NULL) {
        // We found a difference and we have no reporter.
        return false;
      }
      is_different = true;
    }

    parent_field->push_back(specific_field);

    switch (change_type) {
      case ADDITION:
        reporter_->ReportAdded(message1, message2, *parent_field);
        ++index2;
        break;
      case DELETION:
        reporter_->ReportDeleted(message1, message2, *parent_field);
        ++index1;
        break;
      case MODIFICATION:
        reporter_->ReportModified(message1, message2, *parent_field);
        ++index1;
        ++index2;
        break;
      case COMPARE_GROUPS:
        if (!CompareUnknownFields(
                message1, message2, fields1[index1].second->group(),
                fields2[index2].second->group(), parent_field)) {
          if (reporter_ == NULL) return false;
          is_different = true;
          reporter_->ReportModified(message1, message2, *parent_field);
        }
        ++index1;
        ++index2;
        break;
      case NO_CHANGE:
        ++index1;
        ++index2;
        if (report_matches_) {
          reporter_->ReportMatched(message1, message2, *parent_field);
        }
    }

    parent_field->pop_back();
  }

  return !is_different;
}